

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_171beb8::SatdTest_Match_Test::TestBody(SatdTest_Match_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *message;
  char in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  AssertHelper AStack_48;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  int total_ref;
  RegisterStateCheckMMX reg_check_mmx;
  int total_simd;
  
  reg_check_mmx.pre_fpu_env_[0]._0_1_ = in_FPUControlWord;
  SatdTestBase<int,_int_(*)(const_int_*,_int)>::FillRandom
            ((SatdTestBase<int,_int_(*)(const_int_*,_int)> *)this);
  reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  total_ref = (*(this->super_SatdTest).super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.
                satd_func_ref_)((this->super_SatdTest).
                                super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.src_,
                                (this->super_SatdTest).
                                super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.satd_size_);
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
  reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
  total_simd = (*(this->super_SatdTest).super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.
                 satd_func_simd_)((this->super_SatdTest).
                                  super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.src_,
                                  (this->super_SatdTest).
                                  super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.satd_size_);
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&reg_check_mmx,"total_ref","total_simd",&total_ref,&total_simd);
  if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x396,(char *)message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_40._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(reg_check_mmx.pre_fpu_env_ + 4));
  return;
}

Assistant:

TEST_P(SatdTest, Match) {
  FillRandom();
  RunComparison();
}